

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

bool exists_unaccessed_path_to_return
               (CFG *cfg,uint32_t block,
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               *blocks,unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                       *visit_cache)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  size_t sVar3;
  bool bVar4;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *in_RAX;
  SmallVector<unsigned_int,_8UL> *pSVar5;
  size_type sVar6;
  ulong uVar7;
  __hashtable *__h;
  __node_base_ptr p_Var8;
  __node_base_ptr p_Var9;
  uint *succ;
  uint *__k;
  long lVar10;
  bool bVar11;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_38;
  
  uVar1 = (blocks->_M_h)._M_bucket_count;
  uVar7 = (ulong)block % uVar1;
  p_Var8 = (blocks->_M_h)._M_buckets[uVar7];
  p_Var9 = (__node_base_ptr)0x0;
  if ((p_Var8 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var8->_M_nxt, p_Var9 = p_Var8, *(uint32_t *)&p_Var8->_M_nxt[1]._M_nxt != block)) {
    while (p_Var8 = p_Var2, p_Var2 = p_Var8->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var9 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var2[1]._M_nxt % uVar1 != uVar7) ||
         (p_Var9 = p_Var8, *(uint *)&p_Var2[1]._M_nxt == block)) goto LAB_0032feb9;
    }
    p_Var9 = (__node_base_ptr)0x0;
  }
LAB_0032feb9:
  if ((p_Var9 == (__node_base_ptr)0x0) || (p_Var9->_M_nxt == (_Hash_node_base *)0x0)) {
    local_38 = in_RAX;
    pSVar5 = diligent_spirv_cross::CFG::get_succeeding_edges(cfg,block);
    if ((pSVar5->super_VectorView<unsigned_int>).buffer_size == 0) {
      bVar11 = true;
    }
    else {
      pSVar5 = diligent_spirv_cross::CFG::get_succeeding_edges(cfg,block);
      sVar3 = (pSVar5->super_VectorView<unsigned_int>).buffer_size;
      bVar11 = sVar3 != 0;
      if (bVar11) {
        __k = (pSVar5->super_VectorView<unsigned_int>).ptr;
        lVar10 = sVar3 << 2;
        do {
          sVar6 = std::
                  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  ::count(&visit_cache->_M_h,__k);
          if (sVar6 == 0) {
            bVar4 = exists_unaccessed_path_to_return(cfg,*__k,blocks,visit_cache);
            if (bVar4) {
              return bVar11;
            }
            local_38 = visit_cache;
            std::
            _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                      ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)visit_cache,__k,&local_38);
          }
          __k = __k + 1;
          lVar10 = lVar10 + -4;
          bVar11 = lVar10 != 0;
        } while (bVar11);
      }
    }
  }
  else {
    bVar11 = false;
  }
  return bVar11;
}

Assistant:

static bool exists_unaccessed_path_to_return(const CFG &cfg, uint32_t block, const unordered_set<uint32_t> &blocks,
                                             unordered_set<uint32_t> &visit_cache)
{
	// This block accesses the variable.
	if (blocks.find(block) != end(blocks))
		return false;

	// We are at the end of the CFG.
	if (cfg.get_succeeding_edges(block).empty())
		return true;

	// If any of our successors have a path to the end, there exists a path from block.
	for (auto &succ : cfg.get_succeeding_edges(block))
	{
		if (visit_cache.count(succ) == 0)
		{
			if (exists_unaccessed_path_to_return(cfg, succ, blocks, visit_cache))
				return true;
			visit_cache.insert(succ);
		}
	}

	return false;
}